

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void Assimp::FBX::Node::WritePropertyNodeAscii
               (string *name,vector<double,_std::allocator<double>_> *v,StreamWriterLE *s,int indent
               )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  pointer pdVar4;
  runtime_error *this;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  string vsize;
  char buffer [32];
  Node node;
  string local_258;
  char local_238 [32];
  Node local_218;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_218.name._M_dataplus._M_p = (pointer)&local_218.name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar2,pcVar2 + name->_M_string_length);
  local_218.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.force_has_children = false;
  Begin(&local_218,s,false,indent);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  StreamWriter<false,_false>::Put<char>(s,'*');
  StreamWriter<false,_false>::PutString(s,&local_258);
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," {\n","");
  StreamWriter<false,_false>::PutString(s,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  if (-1 < indent) {
    iVar5 = indent + 1;
    do {
      StreamWriter<false,_false>::Put<char>(s,'\t');
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"a: ","");
  StreamWriter<false,_false>::PutString(s,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar4) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      if (uVar6 != 0) {
        StreamWriter<false,_false>::Put<char>(s,',');
        pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar3 = snprintf(local_238,0x20,"%f",SUB84(pdVar4[uVar6],0));
      iVar5 = iVar5 + uVar3;
      if (0x800 < iVar5) {
        iVar5 = 0;
        StreamWriter<false,_false>::Put<char>(s,'\n');
      }
      if (0x1f < uVar3) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"failed to convert double to string","");
        std::runtime_error::runtime_error(this,(string *)local_1a8);
        *(undefined ***)this = &PTR__runtime_error_007fc4b8;
        __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          StreamWriter<false,_false>::Put<char>(s,local_238[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      uVar6 = uVar6 + 1;
      pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
  }
  StreamWriter<false,_false>::Put<char>(s,'\n');
  iVar5 = indent;
  if (0 < indent) {
    do {
      StreamWriter<false,_false>::Put<char>(s,'\t');
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  StreamWriter<false,_false>::Put<char>(s,'}');
  StreamWriter<false,_false>::Put<char>(s,' ');
  End(&local_218,s,false,indent,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_218.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_218.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.name._M_dataplus._M_p != &local_218.name.field_2) {
    operator_delete(local_218.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBX::Node::WritePropertyNodeAscii(
    const std::string& name,
    const std::vector<double>& v,
    Assimp::StreamWriterLE& s,
    int indent
){
    char buffer[32];
    FBX::Node node(name);
    node.Begin(s, false, indent);
    std::string vsize = to_string(v.size());
    // *<size> {
    s.PutChar('*'); s.PutString(vsize); s.PutString(" {\n");
    // indent + 1
    for (int i = 0; i < indent + 1; ++i) { s.PutChar('\t'); }
    // a: value,value,value,...
    s.PutString("a: ");
    int count = 0;
    for (size_t i = 0; i < v.size(); ++i) {
        if (i > 0) { s.PutChar(','); }
        int len = ai_snprintf(buffer, sizeof(buffer), "%f", v[i]);
        count += len;
        if (count > 2048) { s.PutChar('\n'); count = 0; }
        if (len < 0 || len > 31) {
            // this should never happen
            throw DeadlyExportError("failed to convert double to string");
        }
        for (int j = 0; j < len; ++j) { s.PutChar(buffer[j]); }
    }
    // }
    s.PutChar('\n');
    for (int i = 0; i < indent; ++i) { s.PutChar('\t'); }
    s.PutChar('}'); s.PutChar(' ');
    node.End(s, false, indent, false);
}